

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_uncompressed.cpp
# Opt level: O3

unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>,_true>
 duckdb::ValidityInitSegment
           (ColumnSegment *segment,block_id_t block_id,
           optional_ptr<duckdb::ColumnSegmentState,_true> segment_state)

{
  data_ptr_t __s;
  BufferManager *pBVar1;
  idx_t __n;
  BufferHandle handle;
  BufferHandle local_30;
  
  pBVar1 = BufferManager::GetBufferManager(*(DatabaseInstance **)(block_id + 0x20));
  if (segment_state.ptr == (ColumnSegmentState *)0xffffffffffffffff) {
    (*pBVar1->_vptr_BufferManager[7])(&local_30,pBVar1,block_id + 0xa8);
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_30.node);
    __s = (local_30.node.ptr)->buffer;
    __n = ColumnSegment::SegmentSize((ColumnSegment *)block_id);
    switchD_012e3010::default(__s,0xff,__n);
    BufferHandle::~BufferHandle(&local_30);
  }
  (segment->super_SegmentBase<duckdb::ColumnSegment>).start = 0;
  return (unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
          )(unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
            )segment;
}

Assistant:

unique_ptr<CompressedSegmentState> ValidityInitSegment(ColumnSegment &segment, block_id_t block_id,
                                                       optional_ptr<ColumnSegmentState> segment_state) {
	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	if (block_id == INVALID_BLOCK) {
		auto handle = buffer_manager.Pin(segment.block);
		memset(handle.Ptr(), 0xFF, segment.SegmentSize());
	}
	return nullptr;
}